

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

void slang::SVInt::buildDivideResult
               (SVInt *result,uint32_t *value,bitwidth_t bitWidth,bool signFlag,uint32_t numWords)

{
  ulong uVar1;
  SVInt SStack_38;
  
  if (result != (SVInt *)0x0) {
    if (numWords == 1) {
      SVInt(&SStack_38,bitWidth,*(uint64_t *)value,signFlag);
      operator=(result,&SStack_38);
      ~SVInt(&SStack_38);
    }
    else {
      SVInt(&SStack_38,bitWidth,0,signFlag);
      operator=(result,&SStack_38);
      ~SVInt(&SStack_38);
      for (uVar1 = 0; (ulong)numWords * 2 != uVar1; uVar1 = uVar1 + 2) {
        *(ulong *)((long)(result->super_SVIntStorage).field_0.pVal + uVar1 * 4) =
             CONCAT44(value[(int)uVar1 + 1],value[uVar1 & 0xffffffff]);
      }
    }
  }
  return;
}

Assistant:

void SVInt::buildDivideResult(SVInt* result, uint32_t* value, bitwidth_t bitWidth, bool signFlag,
                              uint32_t numWords) {
    if (!result)
        return;

    if (numWords == 1) {
        uint64_t val = uint64_t(value[0]) | (uint64_t(value[1]) << (BITS_PER_WORD / 2));
        *result = SVInt(bitWidth, val, signFlag);
    }
    else {
        *result = SVInt(bitWidth, 0, signFlag);
        for (uint32_t i = 0; i < numWords; i++)
            result->pVal[i] = uint64_t(value[i * 2]) |
                              (uint64_t(value[i * 2 + 1]) << (BITS_PER_WORD / 2));
    }
}